

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,UnknownField *other)

{
  Type TVar1;
  string *this_00;
  UnknownFieldSet *this_01;
  UnknownFieldSet *group;
  UnknownField *other_local;
  UnknownField *this_local;
  
  TVar1 = type(this);
  if (TVar1 == TYPE_LENGTH_DELIMITED) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00,(string *)(this->data_).group_);
    (this->data_).group_ = (UnknownFieldSet *)this_00;
  }
  else if (TVar1 == TYPE_GROUP) {
    this_01 = (UnknownFieldSet *)operator_new(8);
    UnknownFieldSet::UnknownFieldSet(this_01);
    UnknownFieldSet::InternalMergeFrom(this_01,(this->data_).group_);
    (this->data_).group_ = this_01;
  }
  return;
}

Assistant:

void UnknownField::DeepCopy(const UnknownField& other) {
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      data_.length_delimited_.string_value_ = new string(
          *data_.length_delimited_.string_value_);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = new UnknownFieldSet();
      group->InternalMergeFrom(*data_.group_);
      data_.group_ = group;
      break;
    }
    default:
      break;
  }
}